

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

TestSpecParser * __thiscall Catch::TestSpecParser::parse(TestSpecParser *this,string *arg)

{
  bool bVar1;
  TestSpecParser *pTVar2;
  undefined8 in_RSI;
  TestSpecParser *in_RDI;
  TestSpecParser *this_00;
  TestSpecParser *this_01;
  string *this_02;
  string local_30 [48];
  
  in_RDI->m_mode = None;
  in_RDI->m_exclusion = false;
  (*in_RDI->m_tagAliases->_vptr_ITagAliasRegistry[3])(local_30,in_RDI->m_tagAliases,in_RSI);
  std::__cxx11::string::operator=((string *)&in_RDI->m_arg,local_30);
  std::__cxx11::string::~string(local_30);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x178b17);
  this_01 = (TestSpecParser *)&in_RDI->m_substring;
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)this_01);
  this_02 = &in_RDI->m_patternName;
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)this_02);
  in_RDI->m_realPatternPos = 0;
  in_RDI->m_pos = 0;
  do {
    this_00 = (TestSpecParser *)in_RDI->m_pos;
    pTVar2 = (TestSpecParser *)std::__cxx11::string::size();
    if (pTVar2 <= this_00) {
LAB_00178bf5:
      endMode(this_00);
      return in_RDI;
    }
    std::__cxx11::string::operator[]((ulong)&in_RDI->m_arg);
    bVar1 = visitChar(this_01,(char)((ulong)this_00 >> 0x38));
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_02,(value_type *)this_01);
      goto LAB_00178bf5;
    }
    in_RDI->m_pos = in_RDI->m_pos + 1;
  } while( true );
}

Assistant:

TestSpecParser& TestSpecParser::parse( std::string const& arg ) {
        m_mode = None;
        m_exclusion = false;
        m_arg = m_tagAliases->expandAliases( arg );
        m_escapeChars.clear();
        m_substring.reserve(m_arg.size());
        m_patternName.reserve(m_arg.size());
        m_realPatternPos = 0;

        for( m_pos = 0; m_pos < m_arg.size(); ++m_pos )
          //if visitChar fails
           if( !visitChar( m_arg[m_pos] ) ){
               m_testSpec.m_invalidSpecs.push_back(arg);
               break;
           }
        endMode();
        return *this;
    }